

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<false>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  Type *addr;
  Type *pTVar1;
  Type *pTVar2;
  PathTypeSuccessorInfo *this_00;
  Data *pDVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  Type pHVar5;
  code *pcVar6;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar7;
  RecyclerWeakReference<Js::DynamicType> *oldType;
  Recycler *pRVar8;
  ScriptContext *pSVar9;
  uint8 oldPathSize;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  PropertyTypes PVar14;
  PropertyIndex PVar15;
  int iVar16;
  PropertyId propertyId;
  undefined4 *puVar17;
  undefined4 extraout_var_00;
  PathTypeSetterSlotIndex *oldSetters;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  TypePath *this_01;
  PathTypeHandlerBase *pPVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined6 extraout_var;
  PathTypeHandlerWithAttr *this_02;
  DynamicType *pDVar19;
  RecyclerWeakReferenceBase *weakRef;
  byte bVar20;
  undefined7 in_register_00000009;
  TypePath *pTVar21;
  uint uVar22;
  char cVar23;
  undefined4 uVar24;
  char16_t *this_03;
  PathTypeHandlerBase *pPVar25;
  char *instance_00;
  Type offsetOfInlineSlots;
  Type *pTVar26;
  ushort uVar27;
  uint uVar28;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_c0;
  JavascriptLibrary *local_b8;
  PathTypeSuccessorKey local_b0;
  undefined4 local_a4;
  RecyclerWeakReference<Js::DynamicType> *local_a0;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  DynamicObject *local_90;
  ulong local_88;
  undefined4 local_80;
  uint local_7c;
  TypePath *local_78;
  PropertyRecord *local_70;
  PathTypeSetterSlotIndex *local_68;
  Recycler *local_60;
  PathTypeHandlerBase *local_58;
  undefined8 local_50;
  ScriptContext *local_48;
  DynamicType *local_40;
  int local_34;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  
  local_80 = (undefined4)CONCAT71(in_register_00000009,shareType);
  local_90 = instance;
  local_48 = scriptContext;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar10) goto LAB_00dc60f3;
    *puVar17 = 0;
  }
  if (local_90 == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d2,"(isObjectLiteral || instance != nullptr)",
                                 "isObjectLiteral || instance != nullptr");
    if (!bVar10) goto LAB_00dc60f3;
    *puVar17 = 0;
  }
  local_88 = (ulong)key >> 0x20;
  local_b8 = (local_48->super_ScriptContextBase).javascriptLibrary;
  local_60 = local_48->recycler;
  local_a0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  local_70 = ScriptContext::GetPropertyName(local_48,key.propertyId);
  this_00 = (this->successorInfo).ptr;
  if (this_00 == (PathTypeSuccessorInfo *)0x0) {
    local_a0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
LAB_00dc55a0:
    local_78 = (this->typePath).ptr;
    local_34 = CONCAT31(local_34._1_3_,((local_78->data).ptr)->pathSize);
    local_b0 = key;
    nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)predecessorType;
    iVar16 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    local_40 = (DynamicType *)CONCAT44(extraout_var_00,iVar16);
    iVar16 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_01,iVar16);
    pDVar3 = (((this->typePath).ptr)->data).ptr;
    bVar12 = pDVar3->pathLength;
    uVar27 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar27 < bVar12) {
      this_03 = L"branching";
      local_50 = (DynamicType *)((ulong)local_50._4_4_ << 0x20);
    }
    else {
      local_50 = (DynamicType *)
                 CONCAT44(local_50._4_4_,
                          (int)CONCAT71((int7)((ulong)pDVar3 >> 8),bVar12 == pDVar3->pathSize));
      this_03 = L"advancing";
    }
    local_58 = this;
    bVar10 = HasSingletonInstance(this);
    if (bVar10) {
      oldSingletonInstanceBefore = (((this->typePath).ptr)->singletonInstance).ptr;
    }
    else {
      oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_03,L"PathTypeHandler",L"PathTypeHandler",local_90,
               &this->super_DynamicTypeHandler,(DynamicType *)nextTypeWeakRef,
               oldSingletonInstanceBefore);
    pDVar19 = local_40;
    pPVar25 = local_58;
    pRVar8 = local_60;
    this_01 = local_78;
    cVar23 = (char)local_88;
    if (uVar27 < bVar12) {
      uVar22 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar10 = (bool)((DAT_015bf345 ^ 1) & ((this->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar25 = (PathTypeHandlerBase *)(this->typePath).ptr;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
        this_01 = TypePath::Branch<false>
                            ((TypePath *)pPVar25,local_60,uVar22,bVar10,(ObjectSlotAttributes *)0x0)
        ;
        pDVar19 = local_40;
      }
      else {
        this_01 = TypePath::Branch<true>
                            ((TypePath *)pPVar25,local_60,uVar22,bVar10,
                             (ObjectSlotAttributes *)local_40);
      }
      local_48->branchCount = local_48->branchCount + 1;
      if (cVar23 == '\a' && pDVar19 == (DynamicType *)0x0) {
        local_50 = (DynamicType *)0x0;
      }
      else {
        local_50 = (DynamicType *)
                   UpdateAttributes(pPVar25,local_60,(ObjectSlotAttributes *)pDVar19,(uint8)local_34
                                    ,((this_01->data).ptr)->pathSize);
      }
      if (cVar23 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_68 = UpdateSetterSlots(this,local_60,oldSetters,(uint8)local_34,
                                     ((this_01->data).ptr)->pathSize);
      }
      else {
        local_68 = (PathTypeSetterSlotIndex *)0x0;
      }
      pPVar18 = this;
      pPVar25 = this;
      if (DAT_015bf361 == 1) {
        bVar10 = DynamicTypeHandler::ShouldFixAnyProperties();
        pTVar21 = (this->typePath).ptr;
        if ((!bVar10) &&
           ((pTVar21->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pPVar18 = (PathTypeHandlerBase *)__tls_get_addr(&PTR_01548f08);
          ((Type *)&pPVar18->super_DynamicTypeHandler)->typeId = TypeIds_Null;
          bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                       ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                       "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar10) goto LAB_00dc60f3;
          ((Type *)&pPVar18->super_DynamicTypeHandler)->typeId = TypeIds_Undefined;
          pTVar21 = (this->typePath).ptr;
        }
        pRVar4 = (pTVar21->singletonInstance).ptr;
        if ((pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef == local_90)) {
          (pTVar21->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
LAB_00dc5a26:
      if (cVar23 == -9) goto LAB_00dc5a2c;
      local_78 = this_01;
      local_34 = TypePath::AddInternal<true>(this_01,local_70);
      uVar24 = 0;
    }
    else {
      if ((char)local_50 != '\0') {
        pPVar25 = (PathTypeHandlerBase *)(local_58->typePath).ptr;
        this_01 = TypePath::Grow((TypePath *)pPVar25,local_60);
        if (cVar23 == '\a' && local_40 == (DynamicType *)0x0) {
          local_50 = (DynamicType *)0x0;
        }
        else {
          local_50 = (DynamicType *)
                     UpdateAttributes(pPVar25,pRVar8,(ObjectSlotAttributes *)local_40,
                                      (uint8)local_34,((this_01->data).ptr)->pathSize);
        }
        pPVar18 = local_58;
        if (cVar23 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
          local_68 = UpdateSetterSlots(local_58,local_60,oldSetters,(uint8)local_34,
                                       ((this_01->data).ptr)->pathSize);
        }
        else {
          local_68 = (PathTypeSetterSlotIndex *)0x0;
        }
        pTVar21 = (pPVar18->typePath).ptr;
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          (*(pPVar18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar18,this_01);
          if ((local_40 != (DynamicType *)0x0) &&
             (iVar16 = (*(pPVar18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])
                                 (pPVar18),
             (DynamicType *)CONCAT44(extraout_var_02,iVar16) == local_40)) {
            (*(pPVar18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar18,local_50);
          }
          if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
             (iVar16 = (*(pPVar18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])
                                 (pPVar18),
             (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_03,iVar16) == oldSetters)) {
            (*(pPVar18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar18,local_68);
          }
          pPVar18 = (PathTypeHandlerBase *)(pPVar18->predecessorType).ptr;
          if (pPVar18 == (PathTypeHandlerBase *)0x0) break;
          iVar16 = (*((Type *)&pPVar18->successorInfo)->ptr->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar16 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar17 = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                         ,0x844,
                                         "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                         ,
                                         "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                        );
            if (!bVar10) goto LAB_00dc60f3;
            *puVar17 = 0;
          }
          pPVar18 = FromTypeHandler(((Type *)&pPVar18->successorInfo)->ptr);
        } while ((pPVar18->typePath).ptr == pTVar21);
        cVar23 = (char)local_88;
        pPVar25 = local_58;
        goto LAB_00dc5a26;
      }
      oldPathSize = (uint8)local_34;
      pPVar18 = (PathTypeHandlerBase *)0x0;
      local_50 = local_40;
      if (local_40 == (DynamicType *)0x0 && cVar23 != '\a') {
        local_50 = (DynamicType *)
                   UpdateAttributes((PathTypeHandlerBase *)this_03,local_60,
                                    (ObjectSlotAttributes *)0x0,(uint8)local_34,
                                    ((local_78->data).ptr)->pathSize);
      }
      local_68 = oldSetters;
      if (oldSetters != (PathTypeSetterSlotIndex *)0x0 || cVar23 != -9) goto LAB_00dc5a26;
      local_68 = UpdateSetterSlots(pPVar25,local_60,(PathTypeSetterSlotIndex *)0x0,oldPathSize,
                                   ((this_01->data).ptr)->pathSize);
LAB_00dc5a2c:
      local_78 = this_01;
      local_34 = TypePath::AddInternal<false>(this_01,local_70);
      uVar24 = (undefined4)CONCAT71((int7)((ulong)pPVar18 >> 8),1);
    }
    uVar28 = ((pPVar25->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar22 = (pPVar25->super_DynamicTypeHandler).slotCapacity;
    uVar27 = (ushort)uVar28;
    if (uVar27 <= (ushort)uVar22) {
      uVar28 = uVar22;
    }
    local_7c = (uint)(pPVar25->super_DynamicTypeHandler).inlineSlotCapacity;
    offsetOfInlineSlots = (pPVar25->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar10 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler
                       (&pPVar25->super_DynamicTypeHandler);
    local_a4 = uVar24;
    if ((bVar10) && ((pPVar25->super_DynamicTypeHandler).slotCapacity < (int)(uVar28 & 0xffff))) {
      PVar15 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_7c = local_7c - (int)CONCAT62(extraout_var,PVar15);
      offsetOfInlineSlots = 0x20;
    }
    bVar10 = (bool)(DAT_015bf361 ^ 1 | (byte)local_80);
    cVar23 = (char)local_88;
    if (local_40 == (DynamicType *)0x0 && cVar23 == '\a') {
      this_02 = (PathTypeHandlerWithAttr *)
                PathTypeHandlerNoAttr::New
                          (local_48,local_78,uVar27,(PropertyIndex)uVar28,(uint16)local_7c,
                           offsetOfInlineSlots,true,bVar10,(DynamicType *)nextTypeWeakRef);
    }
    else {
      iVar16 = (*(local_58->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      *(char *)((long)&(local_50->super_Type).typeId + (ulong)(PropertyIndex)local_34) = cVar23;
      this_02 = PathTypeHandlerWithAttr::New
                          (local_48,local_78,(ObjectSlotAttributes *)local_50,local_68,
                           (char)iVar16 + (char)local_a4,uVar27,(PropertyIndex)uVar28,
                           (uint16)local_7c,offsetOfInlineSlots,true,bVar10,
                           (DynamicType *)nextTypeWeakRef);
    }
    if (bVar10 == false) {
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_02,'\b');
    }
    bVar12 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_02);
    pPVar25 = local_58;
    if ((bVar12 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar11) goto LAB_00dc60f3;
      *puVar17 = 0;
    }
    PVar14 = DynamicTypeHandler::GetPropertyTypes(&pPVar25->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_02,0xb0,PVar14);
    PVar14 = DynamicTypeHandler::GetPropertyTypes(&pPVar25->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,'@',PVar14);
    if ((byte)local_80 != '\0') {
      AddBlankFieldAt((PathTypeHandlerBase *)this_02,local_70->pid,(PropertyIndex)local_34,local_48)
      ;
    }
    if (local_b0.propertyId == 0x67) {
      (this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    else if ((uint)local_b0.propertyId < 0x10) {
      (this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar16 = ((pPVar25->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar16 < local_48->maxPathLength) {
      iVar16 = local_48->maxPathLength;
    }
    local_48->maxPathLength = iVar16;
    iVar16 = (*(local_90->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])();
    pDVar19 = (DynamicType *)CONCAT44(extraout_var_04,iVar16);
    pHVar5 = (nextTypeWeakRef->super_RecyclerWeakReferenceBase).weakRefHeapBlock;
    addr = &(pDVar19->super_Type).prototype;
    Memory::Recycler::WBSetBit((char *)addr);
    (pDVar19->super_Type).prototype.ptr = (RecyclableObject *)pHVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)&pDVar19->typeHandler);
    (pDVar19->typeHandler).ptr = (DynamicTypeHandler *)this_02;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pDVar19->typeHandler);
    DynamicType::SetIsLocked(pDVar19);
    if (bVar10 != false) {
      DynamicType::SetIsShared(pDVar19);
    }
    pRVar8 = local_60;
    local_40 = pDVar19;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&local_60->weakReferenceMap,(char *)pDVar19,local_60);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&DynamicType::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(pRVar8,weakRef);
    }
    this = local_58;
    oldType = nextTypeWeakRef;
    instance_00 = (char *)local_58;
    SetSuccessor(local_58,(DynamicType *)nextTypeWeakRef,local_b0,
                 (RecyclerWeakReference<Js::DynamicType> *)weakRef,local_48);
    if ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)((local_78->data).ptr)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8aa,
                                   "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                   "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar10) goto LAB_00dc60f3;
      *puVar17 = 0;
    }
    if ((DAT_015bf361 == 1 && (byte)local_80 == '\0') &&
       ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)((local_78->data).ptr)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8ac,
                                   "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                   ,
                                   "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                  );
      if (!bVar10) goto LAB_00dc60f3;
      *puVar17 = 0;
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)instance_00,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)this_02,(DynamicType *)oldType,local_40,
               oldSingletonInstanceBefore);
    local_48->promoteCount = local_48->promoteCount + 1;
  }
  else {
    bVar10 = PathTypeSuccessorInfo::GetSuccessor(this_00,key,&local_a0);
    if ((!bVar10) ||
       (local_40 = (DynamicType *)(local_a0->super_RecyclerWeakReferenceBase).strongRef,
       local_40 == (DynamicType *)0x0)) goto LAB_00dc55a0;
    local_48->cacheCount = local_48->cacheCount + 1;
    this_02 = (PathTypeHandlerWithAttr *)(local_40->typeHandler).ptr;
    if (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 != ((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c3,
                                   "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                   ,
                                   "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                  );
      if (!bVar10) goto LAB_00dc60f3;
      *puVar17 = 0;
    }
    pDVar19 = local_40;
    local_34 = (*(this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                 super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(this_02,local_70);
    bVar12 = (this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
             super_DynamicTypeHandler.flags;
    if (((DAT_015bf361 != 1) || ((bVar12 & 8) == 0)) &&
       (((bVar12 & 0x10) == 0 || (pDVar19->isShared == false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c8,
                                   "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                   ,
                                   "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                  );
      if (!bVar10) goto LAB_00dc60f3;
      *puVar17 = 0;
      pDVar19 = local_40;
    }
    pSVar9 = local_48;
    if (((DAT_015bf361 & 1) != 0) && (pDVar19->isShared == false)) {
      if (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
           .flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)this_02,local_70->pid,(PropertyIndex)local_34,
                        local_48);
        pDVar19 = local_40;
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)this_02,pSVar9);
      }
      DynamicType::ShareType(pDVar19);
    }
  }
  if ((DAT_015bf345 == 1) &&
     (bVar12 = (this->super_DynamicTypeHandler).flags, (bVar12 & 0x20) != 0 && (bVar12 & 0x18) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d5,
                                 "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                 ,
                                 "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                                );
    if (!bVar10) goto LAB_00dc60f3;
    *puVar17 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_02,(this->super_DynamicTypeHandler).flags & 0x20);
  bVar12 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar13 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_02);
  bVar20 = (byte)local_88 & 0x14;
  if ((bVar20 == 4 & (bVar13 ^ bVar12) >> 4) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d7,
                                 "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                 ,
                                 "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                                );
    if (!bVar10) goto LAB_00dc60f3;
    *puVar17 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d8,
                                 "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                 ,
                                 "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                                );
    if (!bVar10) goto LAB_00dc60f3;
    *puVar17 = 0;
  }
  PVar14 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,0xa0,PVar14);
  pTVar2 = &local_b8->typesWithOnlyWritablePropertyProtoChain;
  Memory::Recycler::WBSetBit((char *)&local_c0);
  local_c0 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_c0);
  pPVar7 = local_c0;
  if ((bVar20 != 4) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_02,false),
     pSVar9 = local_48,
     ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_48,local_70);
    ScriptContext::InvalidateStoreFieldCaches(pSVar9,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar7);
  }
  pTVar26 = &local_b8->typesWithNoSpecialPropertyProtoChain;
  Memory::Recycler::WBSetBit((char *)&local_c0);
  local_c0 = pTVar26;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_c0);
  pPVar7 = local_c0;
  bVar10 = NoSpecialPropertyCache::IsSpecialProperty(local_70);
  if ((bVar10) &&
     (pTVar1 = &(this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                super_DynamicTypeHandler.propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar7);
  }
  *propertyIndex = (PropertyIndex)local_34;
  if ((PathTypeHandlerBase *)
      (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)"
                                 ,"Promoting this type to a successor with a different predecessor?"
                                );
    if (!bVar10) {
LAB_00dc60f3:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar17 = 0;
  }
  return local_40;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }